

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

void fileTimeToUtc(uint64_t fileTime,time_t *timep,long *ns)

{
  long *ns_local;
  time_t *timep_local;
  uint64_t fileTime_local;
  
  if (fileTime < 0x19db1ded53e8000) {
    *timep = 0;
    *ns = 0;
  }
  else {
    *timep = (fileTime + 0xfe624e212ac18000) / 10000000;
    *ns = ((fileTime + 0xfe624e212ac18000) % 10000000) * 100;
  }
  return;
}

Assistant:

static void
fileTimeToUtc(uint64_t fileTime, time_t *timep, long *ns)
{

	if (fileTime >= EPOC_TIME) {
		fileTime -= EPOC_TIME;
		/* milli seconds base */
		*timep = (time_t)(fileTime / 10000000);
		/* nano seconds base */
		*ns = (long)(fileTime % 10000000) * 100;
	} else {
		*timep = 0;
		*ns = 0;
	}
}